

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingElement::~IfcReinforcingElement(IfcReinforcingElement *this)

{
  ~IfcReinforcingElement
            ((IfcReinforcingElement *)
             &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
              super_IfcProduct.super_IfcObject.field_0x50);
  return;
}

Assistant:

IfcReinforcingElement() : Object("IfcReinforcingElement") {}